

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__write3(stbi__write_context *s,uchar a,uchar b,uchar c)

{
  int iVar1;
  undefined1 in_CL;
  undefined1 in_DL;
  undefined1 in_SIL;
  long in_RDI;
  int n;
  
  if (0x40 < *(int *)(in_RDI + 0x50) + 3U) {
    stbiw__write_flush((stbi__write_context *)0x17d049);
  }
  iVar1 = *(int *)(in_RDI + 0x50);
  *(int *)(in_RDI + 0x50) = iVar1 + 3;
  *(undefined1 *)(in_RDI + 0x10 + (long)iVar1) = in_SIL;
  *(undefined1 *)(in_RDI + 0x10 + (long)(iVar1 + 1)) = in_DL;
  *(undefined1 *)(in_RDI + 0x10 + (long)(iVar1 + 2)) = in_CL;
  return;
}

Assistant:

static void stbiw__write3(stbi__write_context *s, unsigned char a, unsigned char b, unsigned char c)
{
   int n;
   if (s->buf_used + 3 > sizeof(s->buffer))
      stbiw__write_flush(s);
   n = s->buf_used;
   s->buf_used = n+3;
   s->buffer[n+0] = a;
   s->buffer[n+1] = b;
   s->buffer[n+2] = c;
}